

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptObject.cpp
# Opt level: O0

bool Js::JavascriptObject::IsPrototypeOfStopAtProxy
               (RecyclableObject *proto,RecyclableObject *object,ScriptContext *scriptContext)

{
  bool bVar1;
  ScriptContext *scriptContext_local;
  RecyclableObject *object_local;
  RecyclableObject *proto_local;
  
  bVar1 = Js::JavascriptOperators::
          MapObjectAndPrototypesUntil<1,Js::JavascriptObject::IsPrototypeOfStopAtProxy(Js::RecyclableObject*,Js::RecyclableObject*,Js::ScriptContext*)::__0>
                    (object,(anon_class_8_1_a879b908)proto);
  return bVar1;
}

Assistant:

bool JavascriptObject::IsPrototypeOfStopAtProxy(RecyclableObject* proto, RecyclableObject* object, ScriptContext* scriptContext)
{
    return JavascriptOperators::MapObjectAndPrototypesUntil<true>(object, [=](RecyclableObject* obj)
    {
        return obj == proto;
    });
}